

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

box_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>,2ul>
::
box_from_bounds<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>>
          (void *param_1)

{
  space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_> *unaff_retaddr;
  
  space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>::compute_bounding_box
            (unaff_retaddr);
  return (box_type *)param_1;
}

Assistant:

box_type box_from_bounds(SpaceWrapper_ space, bounds_from_space_t) const {
    return space.compute_bounding_box();
  }